

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O0

void h_scroll_indicator_draw_proc(Am_Object *self,Am_Drawonable *draw,int x_offset,int y_offset)

{
  am_rect arrow_rect;
  bool bVar1;
  int iVar2;
  uint left_00;
  int width_00;
  int height_00;
  Am_Value *pAVar3;
  undefined8 in_stack_ffffffffffffff28;
  undefined4 uVar6;
  undefined8 uVar4;
  ulong uVar5;
  int local_7c;
  int x;
  undefined1 auStack_64 [8];
  am_rect r;
  Am_Widget_Look local_44;
  Computed_Colors_Record CStack_40;
  Am_Widget_Look look;
  Computed_Colors_Record color_rec;
  bool active;
  int height;
  int width;
  int top;
  int left;
  int y_offset_local;
  int x_offset_local;
  Am_Drawonable *draw_local;
  Am_Object *self_local;
  
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  pAVar3 = Am_Object::Get(self,100,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  left_00 = iVar2 + x_offset;
  pAVar3 = Am_Object::Get(self,0x65,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  iVar2 = iVar2 + y_offset;
  pAVar3 = Am_Object::Get(self,0x66,0);
  width_00 = Am_Value::operator_cast_to_int(pAVar3);
  pAVar3 = Am_Object::Get(self,0x67,0);
  height_00 = Am_Value::operator_cast_to_int(pAVar3);
  pAVar3 = Am_Object::Get(self,0xcc,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
  pAVar3 = Am_Object::Get(self,0x1ad,0);
  Computed_Colors_Record::Computed_Colors_Record(&stack0xffffffffffffffc0,pAVar3);
  pAVar3 = Am_Object::Get(self,0x17f,0);
  Am_Widget_Look::Am_Widget_Look(&local_44,pAVar3);
  if (local_44.value == Am_MOTIF_LOOK_val) {
    Am_Draw_Motif_Box(left_00,iVar2,width_00,height_00,false,&stack0xffffffffffffffc0,draw);
  }
  else if (local_44.value == Am_WINDOWS_LOOK_val) {
    am_rect::am_rect((am_rect *)auStack_64,left_00,iVar2,width_00,height_00);
    arrow_rect.width = r.left;
    arrow_rect.height = r.top;
    arrow_rect.left = auStack_64._0_4_;
    arrow_rect.top = auStack_64._4_4_;
    draw_win_arrow_box(arrow_rect,false,false,&stack0xffffffffffffffc0,draw);
  }
  else {
    if (local_44.value != Am_MACINTOSH_LOOK_val) {
      Am_Error("Unknown Look parameter");
    }
    if (bVar1) {
      uVar4 = CONCAT44(uVar6,0xe);
      (*draw->_vptr_Am_Drawonable[0x2c])
                (draw,&(CStack_40.data)->highlight_style,&(CStack_40.data)->background_style,
                 (ulong)(left_00 + 1),(ulong)(iVar2 + 1),0xf,uVar4,0);
      uVar4 = CONCAT44((int)((ulong)uVar4 >> 0x20),iVar2 + 0xe);
      (*draw->_vptr_Am_Drawonable[0x2b])
                (draw,&(CStack_40.data)->shadow_style,&Am_No_Style,(ulong)left_00,
                 (ulong)(iVar2 + 1U),(ulong)left_00,uVar4,left_00 + 0xf,iVar2 + 0xe,left_00 + 0xf,
                 iVar2 + 1U,0);
      uVar5 = CONCAT44((int)((ulong)uVar4 >> 0x20),6);
      (*draw->_vptr_Am_Drawonable[0x2c])
                (draw,&Am_No_Style,&(CStack_40.data)->highlight_style,(ulong)(left_00 + 4),
                 (ulong)(iVar2 + 5),9,uVar5,0);
      for (local_7c = 5; local_7c < 0xc; local_7c = local_7c + 2) {
        uVar5 = uVar5 & 0xffffffff00000000;
        (*draw->_vptr_Am_Drawonable[0x28])
                  (draw,&(CStack_40.data)->background_style,(ulong)(left_00 + local_7c),
                   (ulong)(iVar2 + 5),(ulong)(left_00 + local_7c),(ulong)(iVar2 + 10),uVar5);
      }
    }
  }
  Computed_Colors_Record::~Computed_Colors_Record(&stack0xffffffffffffffc0);
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, h_scroll_indicator_draw,
                 (Am_Object self, Am_Drawonable *draw, int x_offset,
                  int y_offset))
{
  int left = (int)self.Get(Am_LEFT) + x_offset;
  int top = (int)self.Get(Am_TOP) + y_offset;
  int width = self.Get(Am_WIDTH);
  int height = self.Get(Am_HEIGHT);
  bool active = self.Get(Am_ACTIVE);
  Computed_Colors_Record color_rec = self.Get(Am_STYLE_RECORD);
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);

  switch (look.value) {
  case Am_MOTIF_LOOK_val:
    Am_Draw_Motif_Box(left, top, width, height, false, color_rec, draw);
    break;

  case Am_WINDOWS_LOOK_val: {
    am_rect r(left, top, width, height);
    draw_win_arrow_box(r, false, false, color_rec, draw);
  } break;

  case Am_MACINTOSH_LOOK_val:
    if (active) {
      draw->Draw_Rectangle(color_rec.data->highlight_style,
                           color_rec.data->background_style, left + 1, top + 1,
                           15, 14);
      draw->Draw_3_Lines(color_rec.data->shadow_style, Am_No_Style, left,
                         top + 1, left, top + 14, left + 15, top + 14,
                         left + 15, top + 1);
      draw->Draw_Rectangle(Am_No_Style, color_rec.data->highlight_style,
                           left + 4, top + 5, 9, 6);
      for (int x = 5; x <= 11; x += 2)
        draw->Draw_Line(color_rec.data->background_style, left + x, top + 5,
                        left + x, top + 10);
    }
    break;

  default:
    Am_Error("Unknown Look parameter");
    break;
  }
}